

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  ZSTD_compressionParameters *cParams;
  uint uVar1;
  int iVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  
  uVar1 = (ms->cParams).minMatch;
  cParams = &ms->cParams;
  iVar18 = (int)ip;
  if (uVar1 - 6 < 2) {
    uVar9 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
    pUVar3 = ms->chainTable;
    pBVar4 = (ms->window).base;
    uVar1 = (ms->window).dictLimit;
    uVar15 = (ms->window).lowLimit;
    uVar19 = iVar18 - (int)pBVar4;
    uVar16 = uVar19 - uVar9;
    if (uVar19 < uVar9) {
      uVar16 = 0;
    }
    uVar8 = (ms->cParams).searchLog;
    uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,ip,6);
    uVar14 = 3;
    iVar18 = 1 << ((byte)uVar8 & 0x1f);
    while( true ) {
      if ((((uVar10 <= uVar15) || (iVar18 == 0)) ||
          (((pBVar4 + uVar10)[uVar14] == ip[uVar14] &&
           ((sVar11 = ZSTD_count(ip,pBVar4 + uVar10,iLimit), uVar14 < sVar11 &&
            (*offsetPtr = (ulong)((uVar19 + 2) - uVar10), uVar14 = sVar11, ip + sVar11 == iLimit))))
          )) || (uVar10 <= uVar16)) break;
      uVar10 = pUVar3[uVar10 & uVar9 - 1];
      iVar18 = iVar18 + -1;
    }
    pZVar5 = ms->dictMatchState;
    uVar16 = 1 << ((byte)(pZVar5->cParams).chainLog & 0x1f);
    pBVar6 = (pZVar5->window).nextSrc;
    pBVar7 = (pZVar5->window).base;
    uVar15 = (int)pBVar6 - (int)pBVar7;
    iVar17 = 0;
    uVar9 = uVar15 - uVar16;
    if (uVar15 < uVar16) {
      uVar9 = 0;
    }
    pUVar3 = pZVar5->chainTable;
    puVar13 = pZVar5->hashTable +
              ((ulong)(*(long *)ip * -0x30e4432340650000) >>
              (-(char)(pZVar5->cParams).hashLog & 0x3fU));
    uVar10 = (pZVar5->window).dictLimit;
    for (; iVar18 != iVar17; iVar17 = iVar17 + 1) {
      uVar8 = *puVar13;
      if (uVar8 <= uVar10) {
        return uVar14;
      }
      if (*(int *)(pBVar7 + uVar8) == *(int *)ip) {
        sVar11 = ZSTD_count_2segments(ip + 4,pBVar7 + (ulong)uVar8 + 4,iLimit,pBVar6,pBVar4 + uVar1)
        ;
        uVar12 = sVar11 + 4;
        if ((uVar14 < uVar12) &&
           (*offsetPtr = (ulong)(((uVar19 - uVar1) + uVar15 + 2) - uVar8), uVar14 = uVar12,
           ip + uVar12 == iLimit)) {
          return uVar12;
        }
      }
      if (uVar8 <= uVar9) {
        return uVar14;
      }
      puVar13 = pUVar3 + (uVar8 & uVar16 - 1);
    }
  }
  else if (uVar1 == 5) {
    uVar9 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
    pUVar3 = ms->chainTable;
    pBVar4 = (ms->window).base;
    uVar1 = (ms->window).dictLimit;
    uVar15 = (ms->window).lowLimit;
    uVar19 = iVar18 - (int)pBVar4;
    uVar16 = uVar19 - uVar9;
    if (uVar19 < uVar9) {
      uVar16 = 0;
    }
    uVar8 = (ms->cParams).searchLog;
    uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,ip,5);
    uVar14 = 3;
    iVar18 = 1 << ((byte)uVar8 & 0x1f);
    while( true ) {
      if ((((uVar10 <= uVar15) || (iVar18 == 0)) ||
          (((pBVar4 + uVar10)[uVar14] == ip[uVar14] &&
           ((sVar11 = ZSTD_count(ip,pBVar4 + uVar10,iLimit), uVar14 < sVar11 &&
            (*offsetPtr = (ulong)((uVar19 + 2) - uVar10), uVar14 = sVar11, ip + sVar11 == iLimit))))
          )) || (uVar10 <= uVar16)) break;
      uVar10 = pUVar3[uVar10 & uVar9 - 1];
      iVar18 = iVar18 + -1;
    }
    pZVar5 = ms->dictMatchState;
    uVar16 = 1 << ((byte)(pZVar5->cParams).chainLog & 0x1f);
    pBVar6 = (pZVar5->window).nextSrc;
    pBVar7 = (pZVar5->window).base;
    uVar15 = (int)pBVar6 - (int)pBVar7;
    iVar17 = 0;
    uVar9 = uVar15 - uVar16;
    if (uVar15 < uVar16) {
      uVar9 = 0;
    }
    pUVar3 = pZVar5->chainTable;
    puVar13 = pZVar5->hashTable +
              ((ulong)(*(long *)ip * -0x30e4432345000000) >>
              (-(char)(pZVar5->cParams).hashLog & 0x3fU));
    uVar10 = (pZVar5->window).dictLimit;
    for (; iVar18 != iVar17; iVar17 = iVar17 + 1) {
      uVar8 = *puVar13;
      if (uVar8 <= uVar10) {
        return uVar14;
      }
      if (*(int *)(pBVar7 + uVar8) == *(int *)ip) {
        sVar11 = ZSTD_count_2segments(ip + 4,pBVar7 + (ulong)uVar8 + 4,iLimit,pBVar6,pBVar4 + uVar1)
        ;
        uVar12 = sVar11 + 4;
        if ((uVar14 < uVar12) &&
           (*offsetPtr = (ulong)(((uVar19 - uVar1) + uVar15 + 2) - uVar8), uVar14 = uVar12,
           ip + uVar12 == iLimit)) {
          return uVar12;
        }
      }
      if (uVar8 <= uVar9) {
        return uVar14;
      }
      puVar13 = pUVar3 + (uVar8 & uVar16 - 1);
    }
  }
  else {
    uVar9 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
    pUVar3 = ms->chainTable;
    pBVar4 = (ms->window).base;
    uVar1 = (ms->window).dictLimit;
    uVar15 = (ms->window).lowLimit;
    uVar19 = iVar18 - (int)pBVar4;
    uVar16 = uVar19 - uVar9;
    if (uVar19 < uVar9) {
      uVar16 = 0;
    }
    uVar8 = (ms->cParams).searchLog;
    uVar10 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,ip,4);
    uVar14 = 3;
    iVar18 = 1 << ((byte)uVar8 & 0x1f);
    while( true ) {
      if ((((uVar10 <= uVar15) || (iVar18 == 0)) ||
          (((pBVar4 + uVar10)[uVar14] == ip[uVar14] &&
           ((sVar11 = ZSTD_count(ip,pBVar4 + uVar10,iLimit), uVar14 < sVar11 &&
            (*offsetPtr = (ulong)((uVar19 + 2) - uVar10), uVar14 = sVar11, ip + sVar11 == iLimit))))
          )) || (uVar10 <= uVar16)) break;
      uVar10 = pUVar3[uVar10 & uVar9 - 1];
      iVar18 = iVar18 + -1;
    }
    pZVar5 = ms->dictMatchState;
    uVar16 = 1 << ((byte)(pZVar5->cParams).chainLog & 0x1f);
    pBVar6 = (pZVar5->window).nextSrc;
    pBVar7 = (pZVar5->window).base;
    uVar15 = (int)pBVar6 - (int)pBVar7;
    iVar17 = 0;
    uVar9 = uVar15 - uVar16;
    if (uVar15 < uVar16) {
      uVar9 = 0;
    }
    iVar2 = *(int *)ip;
    pUVar3 = pZVar5->chainTable;
    puVar13 = pZVar5->hashTable +
              ((uint)(iVar2 * -0x61c8864f) >> (-(char)(pZVar5->cParams).hashLog & 0x1fU));
    uVar10 = (pZVar5->window).dictLimit;
    for (; iVar18 != iVar17; iVar17 = iVar17 + 1) {
      uVar8 = *puVar13;
      if (uVar8 <= uVar10) {
        return uVar14;
      }
      if (*(int *)(pBVar7 + uVar8) == iVar2) {
        sVar11 = ZSTD_count_2segments(ip + 4,pBVar7 + (ulong)uVar8 + 4,iLimit,pBVar6,pBVar4 + uVar1)
        ;
        uVar12 = sVar11 + 4;
        if ((uVar14 < uVar12) &&
           (*offsetPtr = (ulong)(((uVar19 - uVar1) + 2 + uVar15) - uVar8), uVar14 = uVar12,
           ip + uVar12 == iLimit)) {
          return uVar12;
        }
      }
      if (uVar8 <= uVar9) {
        return uVar14;
      }
      puVar13 = pUVar3 + (uVar8 & uVar16 - 1);
    }
  }
  return uVar14;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dictMatchState);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dictMatchState);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dictMatchState);
    }
}